

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O0

void cmQtAutoGeneratorInitializer::InitializeAutogenSources(cmGeneratorTarget *target)

{
  bool bVar1;
  string local_90;
  undefined1 local_70 [8];
  string mocsComp;
  cmMakefile *makefile;
  allocator local_31;
  string local_30;
  cmGeneratorTarget *local_10;
  cmGeneratorTarget *target_local;
  
  local_10 = target;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"AUTOMOC",&local_31);
  bVar1 = cmGeneratorTarget::GetPropertyAsBool(target,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (bVar1) {
    mocsComp.field_2._8_8_ = cmTarget::GetMakefile(local_10->Target);
    GetAutogenTargetBuildDir_abi_cxx11_(&local_90,local_10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   &local_90,"/mocs_compilation.cpp");
    std::__cxx11::string::~string((string *)&local_90);
    AddGeneratedSource((cmMakefile *)mocsComp.field_2._8_8_,(string *)local_70,MOC);
    cmGeneratorTarget::AddSource(local_10,(string *)local_70);
    std::__cxx11::string::~string((string *)local_70);
  }
  return;
}

Assistant:

void cmQtAutoGeneratorInitializer::InitializeAutogenSources(
  cmGeneratorTarget* target)
{
  if (target->GetPropertyAsBool("AUTOMOC")) {
    cmMakefile* makefile = target->Target->GetMakefile();
    // Mocs compilation file
    const std::string mocsComp =
      GetAutogenTargetBuildDir(target) + "/mocs_compilation.cpp";
    AddGeneratedSource(makefile, mocsComp, cmQtAutoGeneratorCommon::MOC);
    target->AddSource(mocsComp);
  }
}